

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

void __thiscall
Centaurus::NFABaseState<char,_int>::print_subgraph
          (NFABaseState<char,_int> *this,wostream *os,int from,wstring *prefix)

{
  pointer pNVar1;
  long *plVar2;
  wostream *pwVar3;
  long lVar4;
  wchar_t *pwVar5;
  pointer pNVar6;
  
  pNVar6 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = (this->m_transitions).
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pNVar6 == pNVar1) {
      return;
    }
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,L"_S",2);
    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,from);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,L" -> ",4);
    pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,L"_S",2);
    pwVar3 = (wostream *)std::wostream::operator<<((wostream *)pwVar3,pNVar6->m_dest);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar3,L" [ label=\"",10);
    operator<<(os,&pNVar6->m_label);
    if (pNVar6->m_long == false) {
      lVar4 = 4;
      pwVar5 = L"\" ];";
    }
    else {
      lVar4 = 0x1d;
      pwVar5 = L"\", penwidth=3, arrowsize=3 ];";
    }
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,pwVar5,lVar4);
    plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar2 == (long *)0x0) break;
    (**(code **)(*plVar2 + 0x50))(plVar2,10);
    std::wostream::put((wchar_t)os);
    std::wostream::flush();
    pNVar6 = pNVar6 + 1;
  }
  std::__throw_bad_cast();
}

Assistant:

void print_subgraph(std::wostream& os, int from, const std::wstring& prefix) const
	{
		for (const auto& t : m_transitions)
		{
			os << prefix << L"_S" << from << L" -> " << prefix << L"_S" << t.dest() << L" [ label=\"";
			os << t.label();
            if (!t.is_long())
            {
                os << L"\" ];" << std::endl;
            }
            else
            {
                os << L"\", penwidth=3, arrowsize=3 ];" << std::endl;
            }
		}
	}